

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

PyObject * pybind11::cpp_function::dispatcher(PyObject *self,PyObject *args_in,PyObject *kwargs_in)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  undefined8 *puVar6;
  PyObject **ppPVar7;
  PyTypeObject *pPVar8;
  PyObject *pPVar9;
  unsigned_long *puVar10;
  PyObject *pPVar11;
  long lVar12;
  size_type sVar13;
  handle *this;
  char *pcVar14;
  ulong uVar15;
  ulong uVar16;
  size_t sVar17;
  undefined8 uVar18;
  reference rVar19;
  reference rVar20;
  bool local_699;
  PyObject *local_688;
  PyTypeObject *local_650;
  instance *pi_1;
  undefined1 local_638 [8];
  string msg_1;
  error_already_set *anon_var_0_4;
  str local_608;
  string local_600;
  handle local_5e0;
  str local_5d8;
  string local_5d0;
  handle local_5b0;
  value_type kwarg;
  dict_iterator __end5;
  dict_iterator __begin5;
  dict *__range5;
  handle hStack_550;
  bool first;
  dict local_548;
  dict kwargs_1;
  error_already_set *anon_var_0_3;
  handle local_518;
  PyObject *local_510;
  str local_508;
  string local_500;
  ulong local_4e0;
  size_t ti;
  handle hStack_4d0;
  bool some_args;
  tuple local_4c8;
  tuple args_;
  size_t ret;
  size_t next;
  size_t end;
  size_t start;
  string local_498 [8];
  string sig;
  undefined1 local_470 [7];
  bool wrote_sig;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  undefined8 *local_410;
  function_record *it2;
  int ctr;
  allocator<char> local_3d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  undefined1 local_378 [8];
  string msg;
  anon_class_1_0_00000001 local_349 [8];
  anon_class_1_0_00000001 append_note_if_missing_header_is_suspected;
  error_already_set *e;
  __forced_unwind *anon_var_0;
  _func_void_exception_ptr **translator;
  iterator __end3_1;
  iterator __begin3_1;
  forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
  *__range3_1;
  forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
  *registered_exception_translators;
  exception_ptr last_exception;
  reference_cast_error *anon_var_0_2;
  loader_life_support local_2d9;
  reference pfStack_2d8;
  loader_life_support guard_1;
  function_call *call_1;
  iterator __end3;
  iterator __begin3;
  vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  *__range3;
  _Bit_type local_2b0;
  PyObject *local_2a8;
  size_t i_1;
  reference_cast_error *anon_var_0_1;
  loader_life_support local_281;
  undefined1 local_280 [7];
  loader_life_support guard;
  vector<bool,_std::allocator<bool>_> second_pass_convert;
  tuple_accessor local_250;
  ulong local_230;
  size_t i;
  size_t local_220;
  size_t args_size;
  handle local_210;
  tuple local_208;
  value_type local_200;
  tuple extra_args;
  dict local_1f0;
  handle local_1e8;
  handle local_1e0;
  handle value_1;
  value_type *arg_rec_2;
  handle hStack_1c8;
  bool copied_kwargs;
  handle value;
  value_type *arg_rec_1;
  handle local_1b0;
  dict kwargs;
  handle local_1a0;
  handle arg;
  argument_record *arg_rec;
  _object *p_Stack_188;
  bool bad_arg;
  handle local_180;
  PyObject *local_178;
  size_t args_copied;
  size_t args_to_copy;
  undefined1 local_160 [8];
  function_call call;
  size_t pos_args;
  size_t num_args;
  function_record *func;
  undefined1 local_d8 [7];
  bool overloaded;
  vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  second_pass;
  object local_b0;
  handle local_a8;
  value_and_holder local_a0;
  instance *local_80;
  instance *pi;
  type_info *tinfo;
  value_and_holder self_value_and_holder;
  handle result;
  handle parent;
  size_t n_args_in;
  function_record *it;
  function_record *overloads;
  PyObject *kwargs_in_local;
  PyObject *args_in_local;
  PyObject *self_local;
  
  puVar6 = (undefined8 *)PyCapsule_GetPointer(self,0);
  iVar5 = PyType_HasFeature(args_in->ob_type,0x4000000);
  if (iVar5 == 0) {
    __assert_fail("PyTuple_Check(args_in)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/pybind11/include/pybind11/pybind11.h"
                  ,0x227,
                  "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                 );
  }
  parent.m_ptr = (PyObject *)args_in[1].ob_refcnt;
  if (parent.m_ptr == (PyObject *)0x0) {
    local_650 = (PyTypeObject *)0x0;
  }
  else {
    iVar5 = PyType_HasFeature(args_in->ob_type,0x4000000);
    if (iVar5 == 0) {
      __assert_fail("PyTuple_Check(args_in)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/pybind11/include/pybind11/pybind11.h"
                    ,0x229,
                    "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                   );
    }
    local_650 = args_in[1].ob_type;
  }
  handle::handle(&result,(PyObject *)local_650);
  handle::handle((handle *)&self_value_and_holder.vh,(PyObject *)0x1);
  memset(&tinfo,0,0x20);
  detail::value_and_holder::value_and_holder((value_and_holder *)&tinfo);
  if ((*(ushort *)((long)puVar6 + 0x59) & 1) != 0) {
    ppPVar7 = handle::ptr(&result);
    pPVar9 = *ppPVar7;
    pPVar8 = (PyTypeObject *)handle::ptr((handle *)(puVar6 + 0xe));
    iVar5 = _PyObject_TypeCheck(pPVar9,pPVar8);
    if (iVar5 == 0) {
      PyErr_SetString(_PyExc_TypeError,"__init__(self, ...) called with invalid `self` argument");
      return (PyObject *)0x0;
    }
    pPVar8 = (PyTypeObject *)handle::ptr((handle *)(puVar6 + 0xe));
    pi = (instance *)detail::get_type_info(pPVar8);
    ppPVar7 = handle::ptr(&result);
    local_80 = (instance *)*ppPVar7;
    detail::instance::get_value_and_holder(&local_a0,local_80,(type_info *)pi,true);
    tinfo = (type_info *)local_a0.inst;
    self_value_and_holder.inst = (instance *)local_a0.index;
    self_value_and_holder.index = (size_t)local_a0.type;
    self_value_and_holder.type = (type_info *)local_a0.vh;
    bVar2 = detail::value_and_holder::instance_registered((value_and_holder *)&tinfo);
    if (bVar2) {
      none::none((none *)&local_b0);
      local_a8 = object::release(&local_b0);
      ppPVar7 = handle::ptr(&local_a8);
      pPVar9 = *ppPVar7;
      none::~none((none *)&local_b0);
      return pPVar9;
    }
  }
  std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>::
  vector((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
          *)local_d8);
  bVar2 = false;
  n_args_in = (size_t)puVar6;
  if (puVar6 != (undefined8 *)0x0) {
    bVar2 = puVar6[0x10] != 0;
  }
  for (; n_args_in != 0; n_args_in = *(size_t *)(n_args_in + 0x80)) {
    pos_args = (size_t)*(ushort *)(n_args_in + 0x5c);
    if ((*(ushort *)(n_args_in + 0x59) >> 5 & 1) != 0) {
      pos_args = pos_args - 1;
    }
    if ((*(ushort *)(n_args_in + 0x59) >> 6 & 1) != 0) {
      pos_args = pos_args - 1;
    }
    call.init_self.m_ptr = (PyObject *)(pos_args - *(ushort *)(n_args_in + 0x5e));
    if ((((*(ushort *)(n_args_in + 0x59) >> 5 & 1) != 0) || (parent.m_ptr <= call.init_self.m_ptr))
       && ((call.init_self.m_ptr <= parent.m_ptr ||
           (pPVar9 = (PyObject *)
                     std::
                     vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                     ::size((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                             *)(n_args_in + 0x18)), call.init_self.m_ptr <= pPVar9)))) {
      args_to_copy = (size_t)result.m_ptr;
      detail::function_call::function_call
                ((function_call *)local_160,(function_record *)n_args_in,result);
      puVar10 = std::min<unsigned_long>((unsigned_long *)&call.init_self,(unsigned_long *)&parent);
      args_copied = *puVar10;
      local_178 = (PyObject *)0x0;
      if ((*(ushort *)(n_args_in + 0x59) >> 1 & 1) != 0) {
        bVar3 = detail::value_and_holder::operator_cast_to_bool((value_and_holder *)&tinfo);
        if (bVar3) {
          (**(code **)(self_value_and_holder.index + 0x38))(&tinfo);
        }
        iVar5 = PyType_HasFeature(args_in->ob_type,0x4000000);
        if (iVar5 == 0) {
          __assert_fail("PyTuple_Check(args_in)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/pybind11/include/pybind11/pybind11.h"
                        ,0x274,
                        "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                       );
        }
        handle::handle(&local_180,(PyObject *)args_in[1].ob_type);
        call.parent.m_ptr = local_180.m_ptr;
        p_Stack_188 = (_object *)&tinfo;
        std::vector<pybind11::handle,std::allocator<pybind11::handle>>::emplace_back<_object*>
                  ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)&call,
                   &stack0xfffffffffffffe78);
        std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)
                   &call.args.
                    super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,false);
        local_178 = (PyObject *)((long)&local_178->ob_refcnt + 1);
      }
      bVar3 = false;
      for (; pPVar9 = local_178, local_178 < args_copied;
          local_178 = (PyObject *)((long)&local_178->ob_refcnt + 1)) {
        pPVar11 = (PyObject *)
                  std::
                  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                  ::size((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                          *)(n_args_in + 0x18));
        if (pPVar9 < pPVar11) {
          local_688 = (PyObject *)
                      std::
                      vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                      ::operator[]((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                    *)(n_args_in + 0x18),(size_type)local_178);
        }
        else {
          local_688 = (PyObject *)0x0;
        }
        arg.m_ptr = local_688;
        if ((((kwargs_in != (PyObject *)0x0) && (local_688 != (PyObject *)0x0)) &&
            (local_688->ob_refcnt != 0)) &&
           (lVar12 = PyDict_GetItemString(kwargs_in,local_688->ob_refcnt), lVar12 != 0)) {
          bVar3 = true;
          break;
        }
        iVar5 = PyType_HasFeature(args_in->ob_type,0x4000000);
        if (iVar5 == 0) {
          __assert_fail("PyTuple_Check(args_in)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/pybind11/include/pybind11/pybind11.h"
                        ,0x283,
                        "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                       );
        }
        handle::handle(&local_1a0,(PyObject *)(&args_in[1].ob_type)[(long)local_178]);
        if (((arg.m_ptr != (PyObject *)0x0) && ((*(byte *)&arg.m_ptr[1].ob_type >> 1 & 1) == 0)) &&
           (bVar4 = detail::object_api<pybind11::handle>::is_none
                              ((object_api<pybind11::handle> *)&local_1a0), bVar4)) {
          bVar3 = true;
          break;
        }
        std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::push_back
                  ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)&call,&local_1a0);
        if (arg.m_ptr == (PyObject *)0x0) {
          local_699 = true;
        }
        else {
          local_699 = (bool)(*(byte *)&arg.m_ptr[1].ob_type & 1);
        }
        std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)
                   &call.args.
                    super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,local_699);
      }
      if (bVar3) {
        kwargs.super_object.super_handle.m_ptr._4_4_ = 4;
      }
      else {
        handle::handle((handle *)&arg_rec_1,kwargs_in);
        reinterpret_borrow<pybind11::dict>((pybind11 *)&local_1b0,(handle)arg_rec_1);
        if (local_178 < (PyObject *)(ulong)*(ushort *)(n_args_in + 0x60)) {
          for (; local_178 < (PyObject *)(ulong)*(ushort *)(n_args_in + 0x60);
              local_178 = (PyObject *)((long)&local_178->ob_refcnt + 1)) {
            value.m_ptr = (PyObject *)
                          std::
                          vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                          ::operator[]((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                        *)(n_args_in + 0x18),local_178);
            handle::handle(&stack0xfffffffffffffe38);
            bVar3 = handle::operator_cast_to_bool((handle *)(value.m_ptr + 1));
            if (bVar3) {
              hStack_1c8.m_ptr = (PyObject *)value.m_ptr[1].ob_refcnt;
            }
            bVar3 = handle::operator_cast_to_bool(&stack0xfffffffffffffe38);
            if (!bVar3) break;
            std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::push_back
                      ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)&call,
                       &stack0xfffffffffffffe38);
            std::vector<bool,_std::allocator<bool>_>::push_back
                      ((vector<bool,_std::allocator<bool>_> *)
                       &call.args.
                        super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                       (bool)(*(byte *)&value.m_ptr[1].ob_type & 1));
          }
          if ((PyObject *)(ulong)*(ushort *)(n_args_in + 0x60) <= local_178) goto LAB_0012426e;
          kwargs.super_object.super_handle.m_ptr._4_4_ = 4;
        }
        else {
LAB_0012426e:
          if (local_178 < pos_args) {
            bVar3 = false;
            for (; local_178 < pos_args; local_178 = (PyObject *)((long)&local_178->ob_refcnt + 1))
            {
              value_1.m_ptr =
                   (PyObject *)
                   std::
                   vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                   ::operator[]((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                 *)(n_args_in + 0x18),local_178);
              handle::handle(&local_1e0);
              if ((kwargs_in != (PyObject *)0x0) && ((value_1.m_ptr)->ob_refcnt != 0)) {
                ppPVar7 = handle::ptr(&local_1b0);
                pPVar9 = (PyObject *)PyDict_GetItemString(*ppPVar7,(value_1.m_ptr)->ob_refcnt);
                handle::handle(&local_1e8,pPVar9);
                local_1e0.m_ptr = local_1e8.m_ptr;
              }
              bVar4 = handle::operator_cast_to_bool(&local_1e0);
              if (bVar4) {
                if (!bVar3) {
                  ppPVar7 = handle::ptr(&local_1b0);
                  pPVar9 = (PyObject *)PyDict_Copy(*ppPVar7);
                  handle::handle((handle *)&extra_args,pPVar9);
                  reinterpret_steal<pybind11::dict>
                            ((pybind11 *)&local_1f0,
                             (handle)extra_args.super_object.super_handle.m_ptr);
                  dict::operator=((dict *)&local_1b0,&local_1f0);
                  dict::~dict(&local_1f0);
                  bVar3 = true;
                }
                ppPVar7 = handle::ptr(&local_1b0);
                PyDict_DelItemString(*ppPVar7,(value_1.m_ptr)->ob_refcnt);
              }
              else {
                bVar4 = handle::operator_cast_to_bool((handle *)(value_1.m_ptr + 1));
                if (bVar4) {
                  local_1e0.m_ptr = (PyObject *)value_1.m_ptr[1].ob_refcnt;
                }
              }
              if ((((*(byte *)&value_1.m_ptr[1].ob_type >> 1 & 1) == 0) &&
                  (bVar4 = detail::object_api<pybind11::handle>::is_none
                                     ((object_api<pybind11::handle> *)&local_1e0), bVar4)) ||
                 (bVar4 = handle::operator_cast_to_bool(&local_1e0), !bVar4)) break;
              std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::push_back
                        ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)&call,
                         &local_1e0);
              std::vector<bool,_std::allocator<bool>_>::push_back
                        ((vector<bool,_std::allocator<bool>_> *)
                         &call.args.
                          super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (bool)(*(byte *)&value_1.m_ptr[1].ob_type & 1));
            }
            if (local_178 < pos_args) {
              kwargs.super_object.super_handle.m_ptr._4_4_ = 4;
              goto LAB_00124b09;
            }
          }
          bVar3 = handle::operator_cast_to_bool(&local_1b0);
          if (((!bVar3) || (bVar3 = dict::empty((dict *)&local_1b0), bVar3)) ||
             ((*(ushort *)(n_args_in + 0x59) >> 6 & 1) != 0)) {
            if ((*(ushort *)(n_args_in + 0x59) >> 5 & 1) != 0) {
              tuple::tuple((tuple *)&local_200,0);
              if (args_copied == 0) {
                handle::handle(&local_210,args_in);
                reinterpret_borrow<pybind11::tuple>((pybind11 *)&local_208,local_210);
                tuple::operator=((tuple *)&local_200,&local_208);
                tuple::~tuple(&local_208);
              }
              else if (local_178 < parent.m_ptr) {
                local_220 = (long)parent.m_ptr - (long)local_178;
                tuple::tuple((tuple *)&i,local_220);
                tuple::operator=((tuple *)&local_200,(tuple *)&i);
                tuple::~tuple((tuple *)&i);
                for (local_230 = 0; local_230 < local_220; local_230 = local_230 + 1) {
                  iVar5 = PyType_HasFeature(args_in->ob_type,0x4000000);
                  if (iVar5 == 0) {
                    __assert_fail("PyTuple_Check(args_in)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/pybind11/include/pybind11/pybind11.h"
                                  ,0x2dc,
                                  "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                                 );
                  }
                  lVar12 = (long)&local_178->ob_refcnt + local_230;
                  tuple::operator[](&local_250,(tuple *)&local_200,local_230);
                  detail::accessor<pybind11::detail::accessor_policies::tuple_item>::operator=
                            (&local_250,(_object **)(&args_in[1].ob_type + lVar12));
                  detail::accessor<pybind11::detail::accessor_policies::tuple_item>::~accessor
                            (&local_250);
                }
              }
              else {
                tuple::tuple((tuple *)&args_size,0);
                tuple::operator=((tuple *)&local_200,(tuple *)&args_size);
                tuple::~tuple((tuple *)&args_size);
              }
              std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::push_back
                        ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)&call,
                         &local_200);
              std::vector<bool,_std::allocator<bool>_>::push_back
                        ((vector<bool,_std::allocator<bool>_> *)
                         &call.args.
                          super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,false);
              object::operator=((object *)
                                &call.args_convert.super__Bvector_base<std::allocator<bool>_>.
                                 _M_impl.super__Bvector_impl_data._M_end_of_storage,
                                (object *)&local_200);
              tuple::~tuple((tuple *)&local_200);
            }
            if ((*(ushort *)(n_args_in + 0x59) >> 6 & 1) != 0) {
              ppPVar7 = handle::ptr(&local_1b0);
              if (*ppPVar7 == (PyObject *)0x0) {
                dict::dict((dict *)&second_pass_convert.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_end_of_storage);
                dict::operator=((dict *)&local_1b0,
                                (dict *)&second_pass_convert.
                                         super__Bvector_base<std::allocator<bool>_>._M_impl.
                                         super__Bvector_impl_data._M_end_of_storage);
                dict::~dict((dict *)&second_pass_convert.super__Bvector_base<std::allocator<bool>_>.
                                     _M_impl.super__Bvector_impl_data._M_end_of_storage);
              }
              std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::push_back
                        ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)&call,
                         &local_1b0);
              std::vector<bool,_std::allocator<bool>_>::push_back
                        ((vector<bool,_std::allocator<bool>_> *)
                         &call.args.
                          super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,false);
              object::operator=(&call.args_ref,(object *)&local_1b0);
            }
            sVar13 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::size
                               ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)&call
                               );
            if ((sVar13 != *(ushort *)(n_args_in + 0x5c)) ||
               (sVar13 = std::vector<bool,_std::allocator<bool>_>::size
                                   ((vector<bool,_std::allocator<bool>_> *)
                                    &call.args.
                                     super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage),
               sVar13 != *(ushort *)(n_args_in + 0x5c))) {
              pybind11_fail(
                           "Internal error: function call dispatcher inserted wrong number of arguments!"
                           );
            }
            std::vector<bool,_std::allocator<bool>_>::vector
                      ((vector<bool,_std::allocator<bool>_> *)local_280);
            if (bVar2) {
              std::vector<bool,_std::allocator<bool>_>::resize
                        ((vector<bool,_std::allocator<bool>_> *)local_280,
                         (ulong)*(ushort *)(n_args_in + 0x5c),false);
              std::vector<bool,_std::allocator<bool>_>::swap
                        ((vector<bool,_std::allocator<bool>_> *)
                         &call.args.
                          super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<bool,_std::allocator<bool>_> *)local_280);
            }
            detail::loader_life_support::loader_life_support(&local_281);
            anon_var_0_1 = (reference_cast_error *)(**(code **)(n_args_in + 0x30))(local_160);
            self_value_and_holder.vh = (void **)anon_var_0_1;
            detail::loader_life_support::~loader_life_support(&local_281);
            ppPVar7 = handle::ptr((handle *)&self_value_and_holder.vh);
            if (*ppPVar7 == (PyObject *)0x1) {
              if (bVar2) {
                for (local_2a8 = (PyObject *)
                                 (long)(int)(uint)((*(ushort *)(n_args_in + 0x59) >> 4 & 1) != 0);
                    local_2a8 < call.init_self.m_ptr;
                    local_2a8 = (PyObject *)((long)&local_2a8->ob_refcnt + 1)) {
                  rVar19 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                     ((vector<bool,_std::allocator<bool>_> *)local_280,
                                      (size_type)local_2a8);
                  local_2b0 = rVar19._M_mask;
                  __range3 = (vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                              *)rVar19._M_p;
                  bVar3 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&__range3);
                  if (bVar3) {
                    std::vector<bool,_std::allocator<bool>_>::swap
                              ((vector<bool,_std::allocator<bool>_> *)
                               &call.args.
                                super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (vector<bool,_std::allocator<bool>_> *)local_280);
                    std::
                    vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                    ::push_back((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                                 *)local_d8,(value_type *)local_160);
                    break;
                  }
                }
              }
              kwargs.super_object.super_handle.m_ptr._4_4_ = 0;
            }
            else {
              kwargs.super_object.super_handle.m_ptr._4_4_ = 2;
            }
            std::vector<bool,_std::allocator<bool>_>::~vector
                      ((vector<bool,_std::allocator<bool>_> *)local_280);
          }
          else {
            kwargs.super_object.super_handle.m_ptr._4_4_ = 4;
          }
        }
LAB_00124b09:
        dict::~dict((dict *)&local_1b0);
      }
      detail::function_call::~function_call((function_call *)local_160);
      if ((kwargs.super_object.super_handle.m_ptr._4_4_ != 0) &&
         (kwargs.super_object.super_handle.m_ptr._4_4_ == 2)) break;
    }
  }
  if (((bVar2) &&
      (bVar2 = std::
               vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
               ::empty((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                        *)local_d8), !bVar2)) &&
     (ppPVar7 = handle::ptr((handle *)&self_value_and_holder.vh), *ppPVar7 == (PyObject *)0x1)) {
    __end3 = std::
             vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
             ::begin((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                      *)local_d8);
    call_1 = (function_call *)
             std::
             vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
             ::end((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                    *)local_d8);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<pybind11::detail::function_call_*,_std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>_>
                                       *)&call_1), bVar2) {
      pfStack_2d8 = __gnu_cxx::
                    __normal_iterator<pybind11::detail::function_call_*,_std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>_>
                    ::operator*(&__end3);
      detail::loader_life_support::loader_life_support(&local_2d9);
      self_value_and_holder.vh = (void **)(*pfStack_2d8->func->impl)(pfStack_2d8);
      detail::loader_life_support::~loader_life_support(&local_2d9);
      ppPVar7 = handle::ptr((handle *)&self_value_and_holder.vh);
      if (*ppPVar7 != (PyObject *)0x1) {
        bVar2 = handle::operator_cast_to_bool((handle *)&self_value_and_holder.vh);
        if (!bVar2) {
          n_args_in = (size_t)pfStack_2d8->func;
        }
        break;
      }
      __gnu_cxx::
      __normal_iterator<pybind11::detail::function_call_*,_std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>_>
      ::operator++(&__end3);
    }
  }
  std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>::
  ~vector((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
           *)local_d8);
  ppPVar7 = handle::ptr((handle *)&self_value_and_holder.vh);
  if (*ppPVar7 == (PyObject *)0x1) {
    if ((*(ushort *)((long)puVar6 + 0x59) >> 3 & 1) == 0) {
      pcVar14 = (char *)*puVar6;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,pcVar14,&local_3d9);
      std::operator+(&local_3b8,&local_3d8,"(): incompatible ");
      pcVar14 = "function";
      if ((*(byte *)((long)puVar6 + 0x59) & 1) != 0) {
        pcVar14 = "constructor";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ctr,pcVar14,(allocator<char> *)((long)&it2 + 7));
      std::operator+(&local_398,&local_3b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ctr);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378,
                     &local_398," arguments. The following argument types are supported:\n");
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&ctr);
      std::allocator<char>::~allocator((allocator<char> *)((long)&it2 + 7));
      std::__cxx11::string::~string((string *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::allocator<char>::~allocator(&local_3d9);
      it2._0_4_ = 0;
      for (local_410 = puVar6; local_410 != (undefined8 *)0x0;
          local_410 = (undefined8 *)local_410[0x10]) {
        it2._0_4_ = (int)it2 + 1;
        std::__cxx11::to_string((string *)local_470,(int)it2);
        std::operator+(&local_450,"    ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_470);
        std::operator+(&local_430,&local_450,". ");
        std::__cxx11::string::operator+=((string *)local_378,(string *)&local_430);
        std::__cxx11::string::~string((string *)&local_430);
        std::__cxx11::string::~string((string *)&local_450);
        std::__cxx11::string::~string((string *)local_470);
        sig.field_2._M_local_buf[0xf] = '\0';
        if ((*(ushort *)((long)puVar6 + 0x59) & 1) != 0) {
          pcVar14 = (char *)local_410[2];
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_498,pcVar14,(allocator<char> *)((long)&start + 7));
          std::allocator<char>::~allocator((allocator<char> *)((long)&start + 7));
          lVar12 = std::__cxx11::string::find((char)local_498,0x28);
          uVar15 = lVar12 + 7;
          uVar16 = std::__cxx11::string::size();
          if (uVar15 < uVar16) {
            next = std::__cxx11::string::find((char *)local_498,0x34e908);
            ret = next + 2;
            args_.super_object.super_handle.m_ptr =
                 (object)std::__cxx11::string::rfind((char *)local_498,0x34eda5);
            uVar16 = std::__cxx11::string::size();
            if (uVar16 <= next) {
              ret = std::__cxx11::string::find((char)local_498,0x29);
              next = ret;
            }
            if ((uVar15 < next) && (uVar16 = std::__cxx11::string::size(), ret < uVar16)) {
              std::__cxx11::string::append((string *)local_378,(ulong)local_498,uVar15);
              std::__cxx11::string::operator+=((string *)local_378,'(');
              std::__cxx11::string::append((string *)local_378,(ulong)local_498,ret);
              sig.field_2._M_local_buf[0xf] = '\x01';
            }
          }
          std::__cxx11::string::~string(local_498);
        }
        if ((sig.field_2._M_local_buf[0xf] & 1U) == 0) {
          std::__cxx11::string::operator+=((string *)local_378,(char *)local_410[2]);
        }
        std::__cxx11::string::operator+=((string *)local_378,"\n");
      }
      std::__cxx11::string::operator+=((string *)local_378,"\nInvoked with: ");
      handle::handle(&stack0xfffffffffffffb30,args_in);
      reinterpret_borrow<pybind11::tuple>((pybind11 *)&local_4c8,hStack_4d0);
      ti._7_1_ = 0;
      for (local_4e0 = (ulong)(int)(uint)((*(ushort *)((long)puVar6 + 0x59) & 1) != 0);
          uVar15 = local_4e0, sVar17 = tuple::size(&local_4c8), uVar15 < sVar17;
          local_4e0 = local_4e0 + 1) {
        if ((ti._7_1_ & 1) == 0) {
          ti._7_1_ = 1;
        }
        else {
          std::__cxx11::string::operator+=((string *)local_378,", ");
        }
        tuple::operator[]((tuple_accessor *)&anon_var_0_3,&local_4c8,local_4e0);
        detail::accessor::operator_cast_to_object((accessor *)&local_518);
        local_510 = local_518.m_ptr;
        repr((pybind11 *)&local_508,local_518);
        str::operator_cast_to_string(&local_500,&local_508);
        std::__cxx11::string::operator+=((string *)local_378,(string *)&local_500);
        std::__cxx11::string::~string((string *)&local_500);
        str::~str(&local_508);
        object::~object((object *)&local_518);
        detail::accessor<pybind11::detail::accessor_policies::tuple_item>::~accessor
                  ((accessor<pybind11::detail::accessor_policies::tuple_item> *)&anon_var_0_3);
      }
      if (kwargs_in != (PyObject *)0x0) {
        handle::handle(&stack0xfffffffffffffab0,kwargs_in);
        reinterpret_borrow<pybind11::dict>((pybind11 *)&local_548,hStack_550);
        bVar2 = dict::empty(&local_548);
        if (!bVar2) {
          if ((ti._7_1_ & 1) != 0) {
            std::__cxx11::string::operator+=((string *)local_378,"; ");
          }
          std::__cxx11::string::operator+=((string *)local_378,"kwargs: ");
          bVar2 = true;
          dict::begin((dict_iterator *)&__end5.super_dict_readonly.pos,&local_548);
          dict::end((dict_iterator *)&kwarg.second,&local_548);
          while (bVar3 = detail::operator!=((It *)&__end5.super_dict_readonly.pos,
                                            (It *)&kwarg.second), bVar3) {
            rVar20 = detail::generic_iterator<pybind11::detail::iterator_policies::dict_readonly>::
                     operator*((generic_iterator<pybind11::detail::iterator_policies::dict_readonly>
                                *)&__end5.super_dict_readonly.pos);
            kwarg.first = rVar20.second.m_ptr;
            local_5b0 = rVar20.first.m_ptr;
            if (bVar2) {
              bVar2 = false;
            }
            else {
              std::__cxx11::string::operator+=((string *)local_378,", ");
              rVar20.second.m_ptr = kwarg.first.m_ptr;
              rVar20.first.m_ptr = local_5b0.m_ptr;
            }
            kwarg.first = rVar20.second.m_ptr;
            local_5b0 = rVar20.first.m_ptr;
            str::str((str *)&local_5e0,"{}=");
            str::format<pybind11::handle&>(&local_5d8,&local_5e0);
            str::operator_cast_to_string(&local_5d0,&local_5d8);
            std::__cxx11::string::operator+=((string *)local_378,(string *)&local_5d0);
            std::__cxx11::string::~string((string *)&local_5d0);
            str::~str(&local_5d8);
            str::~str((str *)&local_5e0);
            repr((pybind11 *)&local_608,kwarg.first);
            str::operator_cast_to_string(&local_600,&local_608);
            std::__cxx11::string::operator+=((string *)local_378,(string *)&local_600);
            std::__cxx11::string::~string((string *)&local_600);
            str::~str(&local_608);
            detail::generic_iterator<pybind11::detail::iterator_policies::dict_readonly>::operator++
                      ((generic_iterator<pybind11::detail::iterator_policies::dict_readonly> *)
                       &__end5.super_dict_readonly.pos);
          }
        }
        dict::~dict(&local_548);
      }
      dispatcher::anon_class_1_0_00000001::operator()(local_349,(string *)local_378);
      uVar1 = _PyExc_TypeError;
      uVar18 = std::__cxx11::string::c_str();
      PyErr_SetString(uVar1,uVar18);
      self_local = (PyObject *)0x0;
      kwargs.super_object.super_handle.m_ptr._4_4_ = 1;
      tuple::~tuple(&local_4c8);
      std::__cxx11::string::~string((string *)local_378);
    }
    else {
      handle::handle((handle *)((long)&msg.field_2 + 8),(PyObject *)&_Py_NotImplementedStruct);
      this = handle::inc_ref((handle *)((long)&msg.field_2 + 8));
      self_local = handle::ptr(this);
    }
  }
  else {
    bVar2 = handle::operator_cast_to_bool((handle *)&self_value_and_holder.vh);
    if (bVar2) {
      if (((*(ushort *)((long)puVar6 + 0x59) & 1) != 0) &&
         (bVar2 = detail::value_and_holder::holder_constructed((value_and_holder *)&tinfo), !bVar2))
      {
        ppPVar7 = handle::ptr(&result);
        (**(code **)(self_value_and_holder.index + 0x30))(*ppPVar7,0);
      }
      ppPVar7 = handle::ptr((handle *)&self_value_and_holder.vh);
      self_local = *ppPVar7;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_638,
                 "Unable to convert function return value to a Python type! The signature was\n\t",
                 (allocator<char> *)((long)&pi_1 + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&pi_1 + 7));
      std::__cxx11::string::operator+=((string *)local_638,*(char **)(n_args_in + 0x10));
      dispatcher::anon_class_1_0_00000001::operator()(local_349,(string *)local_638);
      uVar1 = _PyExc_TypeError;
      uVar18 = std::__cxx11::string::c_str();
      PyErr_SetString(uVar1,uVar18);
      self_local = (PyObject *)0x0;
      kwargs.super_object.super_handle.m_ptr._4_4_ = 1;
      std::__cxx11::string::~string((string *)local_638);
    }
  }
  return self_local;
}

Assistant:

static PyObject *dispatcher(PyObject *self, PyObject *args_in, PyObject *kwargs_in) {
        using namespace detail;

        /* Iterator over the list of potentially admissible overloads */
        const function_record *overloads = (function_record *) PyCapsule_GetPointer(self, nullptr),
                              *it = overloads;

        /* Need to know how many arguments + keyword arguments there are to pick the right overload */
        const auto n_args_in = (size_t) PyTuple_GET_SIZE(args_in);

        handle parent = n_args_in > 0 ? PyTuple_GET_ITEM(args_in, 0) : nullptr,
               result = PYBIND11_TRY_NEXT_OVERLOAD;

        auto self_value_and_holder = value_and_holder();
        if (overloads->is_constructor) {
            if (!PyObject_TypeCheck(parent.ptr(), (PyTypeObject *) overloads->scope.ptr())) {
                PyErr_SetString(PyExc_TypeError, "__init__(self, ...) called with invalid `self` argument");
                return nullptr;
            }

            const auto tinfo = get_type_info((PyTypeObject *) overloads->scope.ptr());
            const auto pi = reinterpret_cast<instance *>(parent.ptr());
            self_value_and_holder = pi->get_value_and_holder(tinfo, true);

            // If this value is already registered it must mean __init__ is invoked multiple times;
            // we really can't support that in C++, so just ignore the second __init__.
            if (self_value_and_holder.instance_registered())
                return none().release().ptr();
        }

        try {
            // We do this in two passes: in the first pass, we load arguments with `convert=false`;
            // in the second, we allow conversion (except for arguments with an explicit
            // py::arg().noconvert()).  This lets us prefer calls without conversion, with
            // conversion as a fallback.
            std::vector<function_call> second_pass;

            // However, if there are no overloads, we can just skip the no-convert pass entirely
            const bool overloaded = it != nullptr && it->next != nullptr;

            for (; it != nullptr; it = it->next) {

                /* For each overload:
                   1. Copy all positional arguments we were given, also checking to make sure that
                      named positional arguments weren't *also* specified via kwarg.
                   2. If we weren't given enough, try to make up the omitted ones by checking
                      whether they were provided by a kwarg matching the `py::arg("name")` name.  If
                      so, use it (and remove it from kwargs; if not, see if the function binding
                      provided a default that we can use.
                   3. Ensure that either all keyword arguments were "consumed", or that the function
                      takes a kwargs argument to accept unconsumed kwargs.
                   4. Any positional arguments still left get put into a tuple (for args), and any
                      leftover kwargs get put into a dict.
                   5. Pack everything into a vector; if we have py::args or py::kwargs, they are an
                      extra tuple or dict at the end of the positional arguments.
                   6. Call the function call dispatcher (function_record::impl)

                   If one of these fail, move on to the next overload and keep trying until we get a
                   result other than PYBIND11_TRY_NEXT_OVERLOAD.
                 */

                const function_record &func = *it;
                size_t num_args = func.nargs;    // Number of positional arguments that we need
                if (func.has_args) --num_args;   // (but don't count py::args
                if (func.has_kwargs) --num_args; //  or py::kwargs)
                size_t pos_args = num_args - func.nargs_kw_only;

                if (!func.has_args && n_args_in > pos_args)
                    continue; // Too many positional arguments for this overload

                if (n_args_in < pos_args && func.args.size() < pos_args)
                    continue; // Not enough positional arguments given, and not enough defaults to fill in the blanks

                function_call call(func, parent);

                size_t args_to_copy = (std::min)(pos_args, n_args_in); // Protect std::min with parentheses
                size_t args_copied = 0;

                // 0. Inject new-style `self` argument
                if (func.is_new_style_constructor) {
                    // The `value` may have been preallocated by an old-style `__init__`
                    // if it was a preceding candidate for overload resolution.
                    if (self_value_and_holder)
                        self_value_and_holder.type->dealloc(self_value_and_holder);

                    call.init_self = PyTuple_GET_ITEM(args_in, 0);
                    call.args.emplace_back(reinterpret_cast<PyObject *>(&self_value_and_holder));
                    call.args_convert.push_back(false);
                    ++args_copied;
                }

                // 1. Copy any position arguments given.
                bool bad_arg = false;
                for (; args_copied < args_to_copy; ++args_copied) {
                    const argument_record *arg_rec = args_copied < func.args.size() ? &func.args[args_copied] : nullptr;
                    if (kwargs_in && arg_rec && arg_rec->name && PyDict_GetItemString(kwargs_in, arg_rec->name)) {
                        bad_arg = true;
                        break;
                    }

                    handle arg(PyTuple_GET_ITEM(args_in, args_copied));
                    if (arg_rec && !arg_rec->none && arg.is_none()) {
                        bad_arg = true;
                        break;
                    }
                    call.args.push_back(arg);
                    call.args_convert.push_back(arg_rec ? arg_rec->convert : true);
                }
                if (bad_arg)
                    continue; // Maybe it was meant for another overload (issue #688)

                // We'll need to copy this if we steal some kwargs for defaults
                dict kwargs = reinterpret_borrow<dict>(kwargs_in);

                // 1.5. Fill in any missing pos_only args from defaults if they exist
                if (args_copied < func.nargs_pos_only) {
                    for (; args_copied < func.nargs_pos_only; ++args_copied) {
                        const auto &arg_rec = func.args[args_copied];
                        handle value;

                        if (arg_rec.value) {
                            value = arg_rec.value;
                        }
                        if (value) {
                            call.args.push_back(value);
                            call.args_convert.push_back(arg_rec.convert);
                        } else
                            break;
                    }

                    if (args_copied < func.nargs_pos_only)
                        continue; // Not enough defaults to fill the positional arguments
                }

                // 2. Check kwargs and, failing that, defaults that may help complete the list
                if (args_copied < num_args) {
                    bool copied_kwargs = false;

                    for (; args_copied < num_args; ++args_copied) {
                        const auto &arg_rec = func.args[args_copied];

                        handle value;
                        if (kwargs_in && arg_rec.name)
                            value = PyDict_GetItemString(kwargs.ptr(), arg_rec.name);

                        if (value) {
                            // Consume a kwargs value
                            if (!copied_kwargs) {
                                kwargs = reinterpret_steal<dict>(PyDict_Copy(kwargs.ptr()));
                                copied_kwargs = true;
                            }
                            PyDict_DelItemString(kwargs.ptr(), arg_rec.name);
                        } else if (arg_rec.value) {
                            value = arg_rec.value;
                        }

                        if (!arg_rec.none && value.is_none()) {
                            break;
                        }

                        if (value) {
                            call.args.push_back(value);
                            call.args_convert.push_back(arg_rec.convert);
                        }
                        else
                            break;
                    }

                    if (args_copied < num_args)
                        continue; // Not enough arguments, defaults, or kwargs to fill the positional arguments
                }

                // 3. Check everything was consumed (unless we have a kwargs arg)
                if (kwargs && !kwargs.empty() && !func.has_kwargs)
                    continue; // Unconsumed kwargs, but no py::kwargs argument to accept them

                // 4a. If we have a py::args argument, create a new tuple with leftovers
                if (func.has_args) {
                    tuple extra_args;
                    if (args_to_copy == 0) {
                        // We didn't copy out any position arguments from the args_in tuple, so we
                        // can reuse it directly without copying:
                        extra_args = reinterpret_borrow<tuple>(args_in);
                    } else if (args_copied >= n_args_in) {
                        extra_args = tuple(0);
                    } else {
                        size_t args_size = n_args_in - args_copied;
                        extra_args = tuple(args_size);
                        for (size_t i = 0; i < args_size; ++i) {
                            extra_args[i] = PyTuple_GET_ITEM(args_in, args_copied + i);
                        }
                    }
                    call.args.push_back(extra_args);
                    call.args_convert.push_back(false);
                    call.args_ref = std::move(extra_args);
                }

                // 4b. If we have a py::kwargs, pass on any remaining kwargs
                if (func.has_kwargs) {
                    if (!kwargs.ptr())
                        kwargs = dict(); // If we didn't get one, send an empty one
                    call.args.push_back(kwargs);
                    call.args_convert.push_back(false);
                    call.kwargs_ref = std::move(kwargs);
                }

                // 5. Put everything in a vector.  Not technically step 5, we've been building it
                // in `call.args` all along.
                #if !defined(NDEBUG)
                if (call.args.size() != func.nargs || call.args_convert.size() != func.nargs)
                    pybind11_fail("Internal error: function call dispatcher inserted wrong number of arguments!");
                #endif

                std::vector<bool> second_pass_convert;
                if (overloaded) {
                    // We're in the first no-convert pass, so swap out the conversion flags for a
                    // set of all-false flags.  If the call fails, we'll swap the flags back in for
                    // the conversion-allowed call below.
                    second_pass_convert.resize(func.nargs, false);
                    call.args_convert.swap(second_pass_convert);
                }

                // 6. Call the function.
                try {
                    loader_life_support guard{};
                    result = func.impl(call);
                } catch (reference_cast_error &) {
                    result = PYBIND11_TRY_NEXT_OVERLOAD;
                }

                if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD)
                    break;

                if (overloaded) {
                    // The (overloaded) call failed; if the call has at least one argument that
                    // permits conversion (i.e. it hasn't been explicitly specified `.noconvert()`)
                    // then add this call to the list of second pass overloads to try.
                    for (size_t i = func.is_method ? 1 : 0; i < pos_args; i++) {
                        if (second_pass_convert[i]) {
                            // Found one: swap the converting flags back in and store the call for
                            // the second pass.
                            call.args_convert.swap(second_pass_convert);
                            second_pass.push_back(std::move(call));
                            break;
                        }
                    }
                }
            }

            if (overloaded && !second_pass.empty() && result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
                // The no-conversion pass finished without success, try again with conversion allowed
                for (auto &call : second_pass) {
                    try {
                        loader_life_support guard{};
                        result = call.func.impl(call);
                    } catch (reference_cast_error &) {
                        result = PYBIND11_TRY_NEXT_OVERLOAD;
                    }

                    if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD) {
                        // The error reporting logic below expects 'it' to be valid, as it would be
                        // if we'd encountered this failure in the first-pass loop.
                        if (!result)
                            it = &call.func;
                        break;
                    }
                }
            }
        } catch (error_already_set &e) {
            e.restore();
            return nullptr;
#ifdef __GLIBCXX__
        } catch ( abi::__forced_unwind& ) {
            throw;
#endif
        } catch (...) {
            /* When an exception is caught, give each registered exception
               translator a chance to translate it to a Python exception
               in reverse order of registration.

               A translator may choose to do one of the following:

                - catch the exception and call PyErr_SetString or PyErr_SetObject
                  to set a standard (or custom) Python exception, or
                - do nothing and let the exception fall through to the next translator, or
                - delegate translation to the next translator by throwing a new type of exception. */

            auto last_exception = std::current_exception();
            auto &registered_exception_translators = get_internals().registered_exception_translators;
            for (auto& translator : registered_exception_translators) {
                try {
                    translator(last_exception);
                } catch (...) {
                    last_exception = std::current_exception();
                    continue;
                }
                return nullptr;
            }
            PyErr_SetString(PyExc_SystemError, "Exception escaped from default exception translator!");
            return nullptr;
        }

        auto append_note_if_missing_header_is_suspected = [](std::string &msg) {
            if (msg.find("std::") != std::string::npos) {
                msg += "\n\n"
                       "Did you forget to `#include <pybind11/stl.h>`? Or <pybind11/complex.h>,\n"
                       "<pybind11/functional.h>, <pybind11/chrono.h>, etc. Some automatic\n"
                       "conversions are optional and require extra headers to be included\n"
                       "when compiling your pybind11 module.";
            }
        };

        if (result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
            if (overloads->is_operator)
                return handle(Py_NotImplemented).inc_ref().ptr();

            std::string msg = std::string(overloads->name) + "(): incompatible " +
                std::string(overloads->is_constructor ? "constructor" : "function") +
                " arguments. The following argument types are supported:\n";

            int ctr = 0;
            for (const function_record *it2 = overloads; it2 != nullptr; it2 = it2->next) {
                msg += "    "+ std::to_string(++ctr) + ". ";

                bool wrote_sig = false;
                if (overloads->is_constructor) {
                    // For a constructor, rewrite `(self: Object, arg0, ...) -> NoneType` as `Object(arg0, ...)`
                    std::string sig = it2->signature;
                    size_t start = sig.find('(') + 7; // skip "(self: "
                    if (start < sig.size()) {
                        // End at the , for the next argument
                        size_t end = sig.find(", "), next = end + 2;
                        size_t ret = sig.rfind(" -> ");
                        // Or the ), if there is no comma:
                        if (end >= sig.size()) next = end = sig.find(')');
                        if (start < end && next < sig.size()) {
                            msg.append(sig, start, end - start);
                            msg += '(';
                            msg.append(sig, next, ret - next);
                            wrote_sig = true;
                        }
                    }
                }
                if (!wrote_sig) msg += it2->signature;

                msg += "\n";
            }
            msg += "\nInvoked with: ";
            auto args_ = reinterpret_borrow<tuple>(args_in);
            bool some_args = false;
            for (size_t ti = overloads->is_constructor ? 1 : 0; ti < args_.size(); ++ti) {
                if (!some_args) some_args = true;
                else msg += ", ";
                try {
                    msg += pybind11::repr(args_[ti]);
                } catch (const error_already_set&) {
                    msg += "<repr raised Error>";
                }
            }
            if (kwargs_in) {
                auto kwargs = reinterpret_borrow<dict>(kwargs_in);
                if (!kwargs.empty()) {
                    if (some_args) msg += "; ";
                    msg += "kwargs: ";
                    bool first = true;
                    for (auto kwarg : kwargs) {
                        if (first) first = false;
                        else msg += ", ";
                        msg += pybind11::str("{}=").format(kwarg.first);
                        try {
                            msg += pybind11::repr(kwarg.second);
                        } catch (const error_already_set&) {
                            msg += "<repr raised Error>";
                        }
                    }
                }
            }

            append_note_if_missing_header_is_suspected(msg);
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else if (!result) {
            std::string msg = "Unable to convert function return value to a "
                              "Python type! The signature was\n\t";
            msg += it->signature;
            append_note_if_missing_header_is_suspected(msg);
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else {
            if (overloads->is_constructor && !self_value_and_holder.holder_constructed()) {
                auto *pi = reinterpret_cast<instance *>(parent.ptr());
                self_value_and_holder.type->init_instance(pi, nullptr);
            }
            return result.ptr();
        }
    }